

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

JavascriptMethod Js::ScriptContext::ProfileModeDeferredParse(ScriptFunction **functionRef)

{
  FunctionProxy *this;
  char16 *pcVar1;
  JavascriptMethod p_Var2;
  JavascriptMethod entryPoint;
  wchar local_68 [2];
  BOOL fParsed;
  char16 debugStringBuffer [42];
  ScriptFunction **functionRef_local;
  
  unique0x10000085 = functionRef;
  this = ScriptFunction::GetFunctionProxy(*functionRef);
  pcVar1 = FunctionProxy::GetDebugNumberSet(this,(wchar (*) [42])local_68);
  p_Var2 = RecyclableObject::GetEntryPoint((RecyclableObject *)*stack0xfffffffffffffff0);
  Output::Trace(ScriptProfilerPhase,
                L"ScriptContext::ProfileModeDeferredParse FunctionNumber : %s, startEntrypoint : 0x%08X\n"
                ,pcVar1,p_Var2);
  entryPoint._4_4_ = 0;
  p_Var2 = JavascriptFunction::DeferredParseCore
                     (stack0xfffffffffffffff0,(BOOL *)((long)&entryPoint + 4));
  return p_Var2;
}

Assistant:

Js::JavascriptMethod ScriptContext::ProfileModeDeferredParse(ScriptFunction ** functionRef)
    {
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

        OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("ScriptContext::ProfileModeDeferredParse FunctionNumber : %s, startEntrypoint : 0x%08X\n"), (*functionRef)->GetFunctionProxy()->GetDebugNumberSet(debugStringBuffer), (*functionRef)->GetEntryPoint());

        BOOL fParsed = FALSE;
        JavascriptMethod entryPoint = Js::JavascriptFunction::DeferredParseCore(functionRef, fParsed);

#ifdef ENABLE_SCRIPT_PROFILING
        OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("\t\tIsParsed : %s, updatedEntrypoint : 0x%08X\n"), IsTrueOrFalse(fParsed), entryPoint);

        //To get the scriptContext we only need the functionProxy
        FunctionProxy *pRootBody = (*functionRef)->GetFunctionProxy();
        ScriptContext *pScriptContext = pRootBody->GetScriptContext();
        if (pScriptContext->IsProfiling() && !pRootBody->GetFunctionBody()->HasFunctionCompiledSent())
        {
            pScriptContext->RegisterScript(pRootBody, FALSE /*fRegisterScript*/);
        }

        // We can come to this function even though we have stopped profiling.
        Assert(!pScriptContext->IsProfiling() || (*functionRef)->GetFunctionBody()->GetProfileSession() == pScriptContext->GetProfileSession());
#endif

        return entryPoint;
    }